

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

uint32_t __thiscall
spirv_cross::CompilerMSL::get_declared_type_size_msl
          (CompilerMSL *this,SPIRType *type,bool is_packed,bool row_major)

{
  BaseType BVar1;
  bool bVar2;
  uint32_t uVar3;
  size_t sVar4;
  CompilerError *this_00;
  uint *puVar5;
  uint local_54;
  uint local_50;
  uint32_t columns;
  uint32_t vecsize;
  uint32_t array_size;
  SPIRType *local_38;
  SPIRType *p_type;
  uint32_t local_28;
  int32_t dim_idx;
  uint32_t type_size;
  bool row_major_local;
  bool is_packed_local;
  SPIRType *type_local;
  CompilerMSL *this_local;
  
  dim_idx._2_1_ = row_major;
  dim_idx._3_1_ = is_packed;
  _type_size = type;
  type_local = (SPIRType *)this;
  if (((type->pointer & 1U) == 0) || (type->storage != StorageClassPhysicalStorageBuffer)) {
    BVar1 = type->basetype;
    if ((BVar1 < Boolean) || ((BVar1 == AtomicCounter || (BVar1 - Image < 3)))) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Querying size of opaque object.");
      __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    bVar2 = VectorView<unsigned_int>::empty(&(type->array).super_VectorView<unsigned_int>);
    if (bVar2) {
      if (_type_size->basetype == Struct) {
        this_local._4_4_ = get_declared_struct_size_msl(this,_type_size,false,false);
      }
      else if ((dim_idx._3_1_ & 1) == 0) {
        local_50 = _type_size->vecsize;
        local_54 = _type_size->columns;
        if (((dim_idx._2_1_ & 1) != 0) && (1 < local_54)) {
          ::std::swap<unsigned_int>(&local_50,&local_54);
        }
        if (local_50 == 3) {
          local_50 = 4;
        }
        this_local._4_4_ = local_50 * local_54 * (_type_size->width >> 3);
      }
      else {
        this_local._4_4_ = _type_size->vecsize * _type_size->columns * (_type_size->width >> 3);
      }
    }
    else {
      vecsize = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,_type_size);
      uVar3 = get_declared_type_array_stride_msl
                        (this,_type_size,(bool)(dim_idx._3_1_ & 1),(bool)(dim_idx._2_1_ & 1));
      columns = 1;
      puVar5 = ::std::max<unsigned_int>(&vecsize,&columns);
      this_local._4_4_ = uVar3 * *puVar5;
    }
  }
  else {
    local_28 = 8;
    sVar4 = VectorView<unsigned_int>::size(&(type->array).super_VectorView<unsigned_int>);
    p_type._4_4_ = (uint32_t)sVar4;
    local_38 = _type_size;
    while( true ) {
      p_type._4_4_ = p_type._4_4_ - 1;
      bVar2 = Compiler::is_pointer((Compiler *)this,local_38);
      if (bVar2 || (int)p_type._4_4_ < 0) break;
      uVar3 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,local_38,p_type._4_4_);
      local_28 = uVar3 * local_28;
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_38->parent_type);
      local_38 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar3);
    }
    this_local._4_4_ = local_28;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t CompilerMSL::get_declared_type_size_msl(const SPIRType &type, bool is_packed, bool row_major) const
{
	// Pointers take 8 bytes each
	// Match both pointer and array-of-pointer here.
	if (type.pointer && type.storage == StorageClassPhysicalStorageBuffer)
	{
		uint32_t type_size = 8;

		// Work our way through potentially layered arrays,
		// stopping when we hit a pointer that is not also an array.
		int32_t dim_idx = (int32_t)type.array.size() - 1;
		auto *p_type = &type;
		while (!is_pointer(*p_type) && dim_idx >= 0)
		{
			type_size *= to_array_size_literal(*p_type, dim_idx);
			p_type = &get<SPIRType>(p_type->parent_type);
			dim_idx--;
		}

		return type_size;
	}

	switch (type.basetype)
	{
	case SPIRType::Unknown:
	case SPIRType::Void:
	case SPIRType::AtomicCounter:
	case SPIRType::Image:
	case SPIRType::SampledImage:
	case SPIRType::Sampler:
		SPIRV_CROSS_THROW("Querying size of opaque object.");

	default:
	{
		if (!type.array.empty())
		{
			uint32_t array_size = to_array_size_literal(type);
			return get_declared_type_array_stride_msl(type, is_packed, row_major) * max<uint32_t>(array_size, 1u);
		}

		if (type.basetype == SPIRType::Struct)
			return get_declared_struct_size_msl(type);

		if (is_packed)
		{
			return type.vecsize * type.columns * (type.width / 8);
		}
		else
		{
			// An unpacked 3-element vector or matrix column is the same memory size as a 4-element.
			uint32_t vecsize = type.vecsize;
			uint32_t columns = type.columns;

			if (row_major && columns > 1)
				swap(vecsize, columns);

			if (vecsize == 3)
				vecsize = 4;

			return vecsize * columns * (type.width / 8);
		}
	}
	}
}